

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DUI.h
# Opt level: O0

_Bool DUI_Checkbox(char *text,_Bool *checked)

{
  size_t sVar1;
  byte *in_RSI;
  char *in_RDI;
  SDL_Rect mark;
  _Bool clicked;
  _Bool hover;
  SDL_Rect bounds;
  int height;
  int width;
  byte local_4e;
  bool local_4d;
  int local_4c;
  int local_48;
  int local_44;
  int local_40;
  byte local_3a;
  undefined1 local_39;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  int local_28;
  int local_24;
  byte *local_20;
  char *local_18;
  int *local_10;
  SDL_Point *local_8;
  
  local_20 = in_RSI;
  local_18 = in_RDI;
  sVar1 = strlen(in_RDI);
  local_30 = (int)sVar1 * _duiStyle.CharSize + _duiStyle.CharSize * 2 + _duiStyle.ButtonPadding * 2;
  local_2c = _duiStyle.CharSize + _duiStyle.ButtonPadding * 2;
  local_38 = _duiCursor.x;
  local_34 = _duiCursor.y;
  local_8 = &_duiMouse;
  local_10 = &local_38;
  local_4d = false;
  if (((_duiCursor.x <= _duiMouse.x) && (local_4d = false, _duiMouse.x < _duiCursor.x + local_30))
     && (local_4d = false, _duiCursor.y <= _duiMouse.y)) {
    local_4d = _duiMouse.y < _duiCursor.y + local_2c;
  }
  local_4e = 0;
  if (local_4d) {
    local_4e = _duiClicked;
  }
  local_3a = local_4e & 1;
  local_39 = local_4d;
  local_28 = local_2c;
  local_24 = local_30;
  if (local_4d) {
    DUI_setColorHover();
  }
  else {
    DUI_setColorDefault();
  }
  SDL_RenderFillRect(_duiRenderer,&local_38);
  DUI_setColorBorder();
  SDL_RenderDrawRect(_duiRenderer,&local_38);
  local_4c = local_38 + _duiStyle.CharSize;
  local_48 = local_34 + _duiStyle.CharSize / 2;
  local_44 = _duiStyle.CharSize;
  local_40 = _duiStyle.CharSize;
  SDL_RenderDrawRect(_duiRenderer,&local_4c,(long)_duiStyle.CharSize % 2 & 0xffffffff);
  if ((local_3a & 1) != 0) {
    *local_20 = (*local_20 & 1) != 1;
  }
  if ((*local_20 & 1) != 0) {
    local_4c = local_4c + 1;
    local_48 = local_48 + 1;
    local_44 = local_44 + -2;
    local_40 = local_40 + -2;
    SDL_RenderFillRect(_duiRenderer,&local_4c);
  }
  _duiCursor.x = _duiStyle.ButtonPadding + _duiStyle.CharSize * 2 + _duiCursor.x;
  _duiCursor.y = _duiStyle.ButtonPadding + _duiCursor.y;
  DUI_Print("%s",local_18);
  _duiCursor.x = local_38 + local_30 + _duiStyle.ButtonMargin;
  _duiCursor.y = local_34;
  return (_Bool)(*local_20 & 1);
}

Assistant:

bool DUI_Checkbox(const char * text, bool * checked)
{
    int width = (strlen(text) * _duiStyle.CharSize) 
        + (_duiStyle.CharSize * 2)
        + (_duiStyle.ButtonPadding * 2);

    int height = _duiStyle.CharSize 
        + (_duiStyle.ButtonPadding * 2);

    SDL_Rect bounds = {
        .x = _duiCursor.x,
        .y = _duiCursor.y,
        .w = width,
        .h = height,
    };

    bool hover = SDL_PointInRect(&_duiMouse, &bounds);
    bool clicked = (hover && _duiClicked);

    if (hover) {
        DUI_setColorHover();
    }
    else {
        DUI_setColorDefault();
    }

    SDL_RenderFillRect(_duiRenderer, &bounds);

    DUI_setColorBorder();
    SDL_RenderDrawRect(_duiRenderer, &bounds);

    SDL_Rect mark = { 
        .x = bounds.x + _duiStyle.CharSize,
        .y = bounds.y + (_duiStyle.CharSize / 2),
        .w = _duiStyle.CharSize,
        .h = _duiStyle.CharSize,
    };

    SDL_RenderDrawRect(_duiRenderer, &mark);

    if (clicked) {
        *checked ^= true;
    }

    if (*checked) {
        ++mark.x;
        ++mark.y;
        mark.w -= 2;
        mark.h -= 2;

        SDL_RenderFillRect(_duiRenderer, &mark);
    }

    _duiCursor.x += _duiStyle.ButtonPadding + (_duiStyle.CharSize * 2);
    _duiCursor.y += _duiStyle.ButtonPadding;

    DUI_Print("%s", text);

    _duiCursor.x = bounds.x + bounds.w + _duiStyle.ButtonMargin;
    _duiCursor.y = bounds.y;

    return *checked;
}